

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getCoeff(Highs *this,HighsInt row,HighsInt col,double *value)

{
  ulong uVar1;
  char *format;
  
  uVar1 = (ulong)(uint)row;
  if (row < 0 || (this->model_).lp_.num_row_ <= row) {
    format = "Row %d supplied to Highs::getCoeff is not in the range [0, %d]\n";
  }
  else {
    if (-1 < col && col < (this->model_).lp_.num_col_) {
      getCoefficientInterface(this,row,col,value);
      return kOk;
    }
    format = "Col %d supplied to Highs::getCoeff is not in the range [0, %d]\n";
    uVar1 = (ulong)(uint)col;
  }
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format,uVar1);
  return kError;
}

Assistant:

HighsStatus Highs::getCoeff(const HighsInt row, const HighsInt col,
                            double& value) const {
  if (row < 0 || row >= model_.lp_.num_row_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Row %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        row, model_.lp_.num_row_);
    return HighsStatus::kError;
  }
  if (col < 0 || col >= model_.lp_.num_col_) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Col %" HIGHSINT_FORMAT
        " supplied to Highs::getCoeff is not in the range [0, %" HIGHSINT_FORMAT
        "]\n",
        col, model_.lp_.num_col_);
    return HighsStatus::kError;
  }
  getCoefficientInterface(row, col, value);
  return HighsStatus::kOk;
}